

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack28_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xfffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1c;
  *puVar1 = (in[1] & 0xffffff) << 4 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x18;
  *puVar1 = (in[2] & 0xfffff) << 8 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x14;
  *puVar1 = (in[3] & 0xffff) << 0xc | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x10;
  *puVar1 = (in[4] & 0xfff) << 0x10 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0xc;
  *puVar1 = (in[5] & 0xff) << 0x14 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 8;
  *puVar1 = (in[6] & 0xf) << 0x18 | *puVar1;
  out[7] = in[6] >> 4;
  out[8] = in[7] & 0xfffffff;
  puVar1 = out + 9;
  *puVar1 = in[7] >> 0x1c;
  *puVar1 = (in[8] & 0xffffff) << 4 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[8] >> 0x18;
  *puVar1 = (in[9] & 0xfffff) << 8 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[9] >> 0x14;
  *puVar1 = (in[10] & 0xffff) << 0xc | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[10] >> 0x10;
  *puVar1 = (in[0xb] & 0xfff) << 0x10 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xb] >> 0xc;
  *puVar1 = (in[0xc] & 0xff) << 0x14 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xc] >> 8;
  *puVar1 = (in[0xd] & 0xf) << 0x18 | *puVar1;
  out[0xf] = in[0xd] >> 4;
  out[0x10] = in[0xe] & 0xfffffff;
  puVar1 = out + 0x11;
  *puVar1 = in[0xe] >> 0x1c;
  *puVar1 = (in[0xf] & 0xffffff) << 4 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0xf] >> 0x18;
  *puVar1 = (in[0x10] & 0xfffff) << 8 | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x10] >> 0x14;
  *puVar1 = (in[0x11] & 0xffff) << 0xc | *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x11] >> 0x10;
  *puVar1 = (in[0x12] & 0xfff) << 0x10 | *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x12] >> 0xc;
  *puVar1 = (in[0x13] & 0xff) << 0x14 | *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x13] >> 8;
  *puVar1 = (in[0x14] & 0xf) << 0x18 | *puVar1;
  out[0x17] = in[0x14] >> 4;
  return in + 0x15;
}

Assistant:

const uint32_t *__fastunpack28_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;

  return in;
}